

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesDH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  BrotliEncoderDictionary *pBVar8;
  void *pvVar9;
  void *pvVar10;
  HasherCommon *pHVar11;
  PreparedDictionary *pPVar12;
  size_t sVar13;
  BrotliDictionary *pBVar14;
  byte bVar15;
  bool bVar16;
  long lVar17;
  uint *puVar18;
  size_t sVar19;
  ulong uVar20;
  byte bVar21;
  size_t sVar22;
  long lVar23;
  ulong uVar24;
  uint8_t *puVar25;
  ulong uVar26;
  ulong *puVar27;
  int iVar28;
  uint32_t uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ushort uVar35;
  uint8_t *s1_orig_8;
  long lVar36;
  uint8_t *puVar37;
  ulong uVar38;
  char cVar39;
  ushort uVar40;
  uint16_t uVar41;
  uint uVar42;
  ulong *puVar43;
  byte bVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined8 *puVar48;
  long lVar49;
  size_t sVar50;
  ulong uVar51;
  ulong *puVar52;
  ulong uVar53;
  ulong uVar54;
  uint8_t *s1_orig_1;
  size_t sVar55;
  uint8_t *s1_orig_6;
  uint uVar56;
  uint32_t *addr;
  bool bVar57;
  long lVar58;
  ulong *puVar59;
  ulong uVar60;
  ulong uVar61;
  size_t key;
  ulong local_1a0;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  int local_15c;
  ulong local_148;
  ulong local_140;
  ulong local_130;
  Command *local_110;
  ulong local_100;
  ulong local_f8;
  uint local_e8;
  int local_e4;
  ulong local_d0;
  ulong local_a0;
  
  iVar31 = params->lgwin;
  sVar6 = params->stream_offset;
  uVar5 = (position - 3) + num_bytes;
  sVar22 = position;
  if (3 < num_bytes) {
    sVar22 = uVar5;
  }
  lVar23 = 0x200;
  if (params->quality < 9) {
    lVar23 = 0x40;
  }
  local_188 = *last_insert_len;
  sVar7 = (params->dictionary).compound.total_size;
  iVar28 = *dist_cache;
  dist_cache[4] = iVar28 + -1;
  dist_cache[5] = iVar28 + 1;
  dist_cache[6] = iVar28 + -2;
  dist_cache[7] = iVar28 + 2;
  *(ulong *)(dist_cache + 8) = CONCAT44(iVar28 + 3,iVar28 + -3);
  uVar2 = position + num_bytes;
  if (uVar2 <= position + 4) {
    local_110 = commands;
LAB_003046eb:
    *last_insert_len = (local_188 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_110 - (long)commands >> 4);
    return;
  }
  uVar54 = (1L << ((byte)iVar31 & 0x3f)) - 0x10;
  local_178 = lVar23 + position;
  lVar1 = sVar7 + 1;
  lVar4 = position - 1;
  local_110 = commands;
  uVar20 = position;
LAB_00302b19:
  uVar32 = uVar54;
  if (uVar20 < uVar54) {
    uVar32 = uVar20;
  }
  uVar34 = uVar20 + sVar6;
  if (uVar54 <= uVar20 + sVar6) {
    uVar34 = uVar54;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_e8 = 0;
    local_a0 = 0;
    goto LAB_00302b99;
  }
  if (uVar20 == 0) {
    local_a0 = 0;
LAB_00302b78:
    uVar47 = 0;
  }
  else {
    local_a0 = (ulong)ringbuffer[uVar20 - 1 & ringbuffer_mask];
    if (uVar20 == 1) goto LAB_00302b78;
    uVar47 = (ulong)ringbuffer[uVar20 - 2 & ringbuffer_mask];
  }
  local_e8 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar47 + 0x100] | literal_context_lut[local_a0]];
LAB_00302b99:
  local_170 = uVar2 - uVar20;
  pBVar8 = (params->dictionary).contextual.dict[local_e8];
  uVar47 = (params->dist).max_distance;
  pvVar9 = (hasher->privat)._H40.extra[0];
  pvVar10 = (hasher->privat)._H40.extra[1];
  uVar46 = uVar20 & ringbuffer_mask;
  puVar3 = (ulong *)(ringbuffer + uVar46);
  uVar42 = (uint)(*(int *)(ringbuffer + uVar46) * 0x1e35a7bd) >> 0x11;
  local_180 = 0x7e4;
  uVar33 = 0;
  lVar49 = 0;
  local_f8 = 0;
  local_100 = 0;
LAB_00302c10:
  uVar53 = (ulong)dist_cache[lVar49];
  uVar24 = uVar20 - uVar53;
  cVar39 = (char)uVar42;
  if ((((lVar49 == 0) || (*(char *)((long)pvVar9 + (uVar24 & 0xffff) + 0x30000) == cVar39)) &&
      (uVar53 <= uVar32)) && (uVar24 < uVar20)) {
    puVar25 = ringbuffer + (uVar24 & ringbuffer_mask);
    uVar24 = local_170;
    puVar37 = puVar25;
    puVar59 = puVar3;
    if (7 < local_170) {
      lVar36 = 0;
      lVar17 = 0;
LAB_00302c67:
      if (*(ulong *)((long)puVar3 + lVar36) == *(ulong *)(puVar25 + lVar36)) goto code_r0x00302c74;
      uVar38 = *(ulong *)(puVar25 + lVar36) ^ *(ulong *)((long)puVar3 + lVar36);
      uVar24 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar17;
      goto LAB_00302d03;
    }
    goto LAB_00302c9f;
  }
  goto LAB_00302d5b;
code_r0x00302c74:
  lVar36 = lVar36 + 8;
  lVar58 = local_170 + lVar17;
  lVar17 = lVar17 + -8;
  if (lVar58 - 8U < 8) goto code_r0x00302c8e;
  goto LAB_00302c67;
code_r0x00302c8e:
  puVar37 = puVar25 + -lVar17;
  puVar59 = (ulong *)((long)puVar3 - lVar17);
  uVar24 = lVar17 + local_170;
LAB_00302c9f:
  if (uVar24 != 0) {
    uVar38 = 0;
    do {
      uVar60 = uVar38;
      if (puVar37[uVar38] != *(uint8_t *)((long)puVar59 + uVar38)) break;
      uVar38 = uVar38 + 1;
      uVar60 = uVar24;
    } while (uVar24 != uVar38);
    puVar37 = puVar37 + uVar60;
  }
  uVar24 = (long)puVar37 - (long)puVar25;
LAB_00302d03:
  if ((1 < uVar24) && (uVar38 = uVar24 * 0x87 + 0x78f, local_180 < uVar38)) {
    if (lVar49 != 0) {
      uVar38 = uVar38 - ((0x1ca10U >> ((byte)lVar49 & 0xe) & 0xe) + 0x27);
    }
    if (local_180 < uVar38) {
      local_100 = uVar53;
      local_f8 = uVar24;
      uVar33 = uVar24;
      local_180 = uVar38;
    }
  }
LAB_00302d5b:
  lVar49 = lVar49 + 1;
  if (lVar49 == 10) goto code_r0x00302d68;
  goto LAB_00302c10;
code_r0x00302d68:
  uVar24 = (ulong)uVar42;
  sVar50 = (hasher->privat)._H5.block_size_;
  uVar53 = uVar20 - *(uint *)((long)pvVar9 + uVar24 * 4);
  if (sVar50 != 0) {
    uVar35 = *(ushort *)((long)pvVar9 + uVar24 * 2 + 0x20000);
    uVar60 = 0;
    uVar38 = uVar53;
LAB_00302da6:
    uVar60 = uVar38 + uVar60;
    if (uVar60 <= uVar32) {
      if (uVar46 + uVar33 <= ringbuffer_mask) {
        uVar26 = uVar20 - uVar60 & ringbuffer_mask;
        uVar38 = uVar26 + uVar33;
        if ((ringbuffer_mask < uVar38) || (ringbuffer[uVar46 + uVar33] != ringbuffer[uVar38]))
        goto LAB_00302eee;
        puVar25 = ringbuffer + uVar26;
        puVar37 = puVar25;
        uVar38 = local_170;
        puVar59 = puVar3;
        if (7 < local_170) {
          lVar49 = 0;
          lVar17 = 0;
LAB_00302e1d:
          if (*(ulong *)((long)puVar3 + lVar49) == *(ulong *)(puVar25 + lVar49))
          goto code_r0x00302e2a;
          uVar26 = *(ulong *)(puVar25 + lVar49) ^ *(ulong *)((long)puVar3 + lVar49);
          uVar38 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar38 = (uVar38 >> 3 & 0x1fffffff) - lVar17;
          goto LAB_00302eb0;
        }
        goto LAB_00302e5d;
      }
      goto LAB_00302eee;
    }
  }
LAB_00302f08:
  uVar35 = (hasher->privat)._H42.free_slot_idx[0];
  (hasher->privat)._H42.free_slot_idx[0] = uVar35 + 1;
  if (0xfffe < uVar53) {
    uVar53 = 0xffff;
  }
  *(char *)((long)pvVar9 + (uVar20 & 0xffff) + 0x30000) = cVar39;
  *(short *)((long)pvVar10 + (ulong)uVar35 * 4) = (short)uVar53;
  *(undefined2 *)((long)pvVar10 + (ulong)uVar35 * 4 + 2) =
       *(undefined2 *)((long)pvVar9 + uVar24 * 2 + 0x20000);
  *(int *)((long)pvVar9 + uVar24 * 4) = (int)uVar20;
  *(ushort *)((long)pvVar9 + uVar24 * 2 + 0x20000) = uVar35;
  if (local_180 == 0x7e4) {
    pHVar11 = (hasher->privat)._H5.common_;
    uVar33 = pHVar11->dict_num_lookups;
    local_180 = pHVar11->dict_num_matches;
    if (uVar33 >> 7 <= local_180) {
      uVar24 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar37 = pBVar8->hash_table_lengths;
      uVar32 = 0x7e4;
      local_15c = 0;
      bVar57 = true;
LAB_00303ff0:
      uVar33 = uVar33 + 1;
      pHVar11->dict_num_lookups = uVar33;
      bVar21 = puVar37[uVar24];
      uVar53 = (ulong)bVar21;
      if ((uVar53 != 0) && (uVar53 <= local_170)) {
        pBVar14 = pBVar8->words;
        puVar27 = (ulong *)(pBVar14->data +
                           (ulong)pBVar14->offsets_by_length[uVar53] +
                           pBVar8->hash_table_words[uVar24] * uVar53);
        uVar38 = uVar53;
        puVar59 = puVar3;
        if (7 < bVar21) {
          lVar49 = 0;
LAB_00304061:
          if (*puVar27 == *puVar59) goto code_r0x0030406d;
          uVar60 = *puVar59 ^ *puVar27;
          uVar38 = 0;
          if (uVar60 != 0) {
            for (; (uVar60 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar38 = (uVar38 >> 3 & 0x1fffffff) - lVar49;
          goto LAB_003040cc;
        }
        goto LAB_00304094;
      }
      goto LAB_00304011;
    }
    local_15c = 0;
    uVar32 = 0x7e4;
  }
  else {
    local_15c = 0;
    uVar32 = local_180;
  }
LAB_00302fb9:
  local_140 = (params->dist).max_distance;
  sVar50 = (params->dictionary).compound.num_chunks;
  local_180 = uVar32;
  if (sVar50 != 0) {
    sVar55 = 0;
LAB_00302ffc:
    pPVar12 = (params->dictionary).compound.chunks[sVar55];
    bVar21 = (byte)pPVar12->bucket_bits;
    bVar44 = (byte)pPVar12->slot_bits;
    bVar15 = -(char)pPVar12->hash_bits;
    uVar32 = ((*puVar3 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar21 & 0x3f);
    lVar49 = (1L << (bVar44 & 0x3f)) * 4;
    lVar17 = (1L << (bVar21 & 0x3f)) * 2;
    bVar44 = -bVar44;
    puVar48 = (undefined8 *)
              ((long)&pPVar12[1].magic + (ulong)pPVar12->num_items * 4 + lVar17 + lVar49);
    if (pPVar12->magic != 0xdebcede0) {
      puVar48 = (undefined8 *)*puVar48;
    }
    uVar47 = (uVar34 + (params->dictionary).compound.total_size) -
             (params->dictionary).compound.chunk_offsets[sVar55];
    uVar33 = (ulong)pPVar12->source_size;
    uVar35 = *(ushort *)((long)&pPVar12[1].magic + (uVar32 & 0xffffffff) * 2 + lVar49);
    puVar18 = (uint *)((long)&pPVar12[1].magic +
                      (ulong)((uint)uVar35 +
                             (&pPVar12[1].magic)
                             [(uint)((int)uVar32 << (bVar44 & 0x1f)) >> (bVar44 & 0x1f)]) * 4 +
                      lVar17 + lVar49);
    lVar49 = 0;
    uVar32 = local_f8;
LAB_003030ba:
    uVar24 = (ulong)dist_cache[lVar49];
    if ((uVar47 - uVar33 < uVar24) && (uVar24 <= uVar47)) {
      uVar53 = uVar33 - (uVar47 - uVar24);
      if (local_170 <= uVar53) {
        uVar53 = local_170;
      }
      lVar36 = (uVar47 - uVar24) + (long)puVar48;
      lVar17 = lVar36;
      puVar59 = puVar3;
      if (7 < uVar53) {
        lVar58 = 0;
LAB_003030f2:
        if (*(ulong *)((long)puVar3 + lVar58) == *(ulong *)(lVar36 + lVar58)) goto code_r0x003030ff;
        uVar38 = *(ulong *)(lVar36 + lVar58) ^ *(ulong *)((long)puVar3 + lVar58);
        uVar53 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
          }
        }
        uVar53 = (uVar53 >> 3 & 0x1fffffff) + lVar58;
        goto LAB_0030315b;
      }
      goto LAB_0030311c;
    }
    goto LAB_003031bb;
  }
LAB_0030333e:
  if (0x7e4 < local_180) {
    local_148 = (lVar4 + num_bytes) - uVar20;
    uVar32 = sVar6 + 1 + uVar20;
    local_e4 = 0;
    uVar34 = local_188;
    uVar35 = (hasher->privat)._H42.free_slot_idx[0];
LAB_003033a5:
    uVar47 = uVar54;
    if (uVar32 < uVar54) {
      uVar47 = uVar32;
    }
    local_170 = local_170 - 1;
    local_130 = local_f8 - 1;
    if (local_170 <= local_f8 - 1) {
      local_130 = local_170;
    }
    if (4 < params->quality) {
      local_130 = 0;
    }
    uVar33 = uVar20 + 1;
    uVar46 = uVar54;
    if (uVar33 < uVar54) {
      uVar46 = uVar33;
    }
    local_d0 = sVar6 + uVar20 + 1;
    if (uVar54 <= local_d0) {
      local_d0 = uVar54;
    }
    if ((params->dictionary).contextual.context_based != 0) {
      local_e8 = (uint)(params->dictionary).contextual.context_map
                       [literal_context_lut[local_a0 + 0x100] |
                        literal_context_lut[ringbuffer[uVar20 & ringbuffer_mask]]];
      local_a0 = (ulong)ringbuffer[uVar20 & ringbuffer_mask];
    }
    pBVar8 = (params->dictionary).contextual.dict[local_e8];
    pvVar9 = (hasher->privat)._H40.extra[0];
    pvVar10 = (hasher->privat)._H40.extra[1];
    uVar24 = uVar33 & ringbuffer_mask;
    puVar3 = (ulong *)(ringbuffer + uVar24);
    uVar42 = (uint)(*(int *)(ringbuffer + uVar24) * 0x1e35a7bd) >> 0x11;
    local_190 = 0x7e4;
    lVar49 = 0;
    local_1a0 = 0;
    local_178 = 0;
LAB_003034cb:
    uVar38 = (ulong)dist_cache[lVar49];
    uVar53 = uVar33 - uVar38;
    cVar39 = (char)uVar42;
    if (((lVar49 == 0) || (*(char *)((long)pvVar9 + (uVar53 & 0xffff) + 0x30000) == cVar39)) &&
       ((uVar38 <= uVar46 && (uVar53 < uVar33)))) {
      puVar25 = ringbuffer + (uVar53 & ringbuffer_mask);
      puVar59 = puVar3;
      puVar37 = puVar25;
      uVar53 = local_170;
      if (7 < local_170) {
        lVar17 = 0;
        lVar36 = 0;
LAB_00303521:
        if (*(ulong *)((long)puVar3 + lVar17) == *(ulong *)(puVar25 + lVar17))
        goto code_r0x0030352e;
        uVar60 = *(ulong *)(puVar25 + lVar17) ^ *(ulong *)((long)puVar3 + lVar17);
        uVar53 = 0;
        if (uVar60 != 0) {
          for (; (uVar60 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
          }
        }
        uVar53 = (uVar53 >> 3 & 0x1fffffff) - lVar36;
        goto LAB_003035ae;
      }
      goto LAB_0030355e;
    }
    goto LAB_003035fc;
  }
  local_188 = local_188 + 1;
  position = uVar20 + 1;
  if (position <= local_178) goto LAB_00304674;
  if ((uint)((int)lVar23 * 4) + local_178 < position) {
    uVar32 = uVar20 + 0x11;
    if (uVar2 - 4 <= uVar20 + 0x11) {
      uVar32 = uVar2 - 4;
    }
    if (uVar32 <= position) goto LAB_00304674;
    pvVar9 = (hasher->privat)._H40.extra[0];
    pvVar10 = (hasher->privat)._H40.extra[1];
    uVar35 = (hasher->privat)._H42.free_slot_idx[0];
    do {
      uVar42 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar20 = (ulong)uVar42;
      uVar34 = position - *(uint *)((long)pvVar9 + uVar20 * 4);
      *(char *)((long)pvVar9 + (position & 0xffff) + 0x30000) = (char)uVar42;
      if (0xfffe < uVar34) {
        uVar34 = 0xffff;
      }
      uVar40 = uVar35 + 1;
      *(short *)((long)pvVar10 + (ulong)uVar35 * 4) = (short)uVar34;
      *(undefined2 *)((long)pvVar10 + (ulong)uVar35 * 4 + 2) =
           *(undefined2 *)((long)pvVar9 + uVar20 * 2 + 0x20000);
      *(int *)((long)pvVar9 + uVar20 * 4) = (int)position;
      *(ushort *)((long)pvVar9 + uVar20 * 2 + 0x20000) = uVar35;
      local_188 = local_188 + 4;
      position = position + 4;
      uVar35 = uVar40;
    } while (position < uVar32);
  }
  else {
    uVar32 = uVar20 + 9;
    if (uVar5 <= uVar20 + 9) {
      uVar32 = uVar5;
    }
    if (uVar32 <= position) goto LAB_00304674;
    pvVar9 = (hasher->privat)._H40.extra[0];
    pvVar10 = (hasher->privat)._H40.extra[1];
    uVar35 = (hasher->privat)._H42.free_slot_idx[0];
    do {
      uVar42 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar20 = (ulong)uVar42;
      uVar34 = position - *(uint *)((long)pvVar9 + uVar20 * 4);
      *(char *)((long)pvVar9 + (position & 0xffff) + 0x30000) = (char)uVar42;
      if (0xfffe < uVar34) {
        uVar34 = 0xffff;
      }
      uVar40 = uVar35 + 1;
      *(short *)((long)pvVar10 + (ulong)uVar35 * 4) = (short)uVar34;
      *(undefined2 *)((long)pvVar10 + (ulong)uVar35 * 4 + 2) =
           *(undefined2 *)((long)pvVar9 + uVar20 * 2 + 0x20000);
      *(int *)((long)pvVar9 + uVar20 * 4) = (int)position;
      *(ushort *)((long)pvVar9 + uVar20 * 2 + 0x20000) = uVar35;
      local_188 = local_188 + 2;
      position = position + 2;
      uVar35 = uVar40;
    } while (position < uVar32);
  }
LAB_0030464b:
  (hasher->privat)._H42.free_slot_idx[0] = uVar40;
LAB_00304674:
  uVar20 = position;
  if (uVar2 <= position + 4) goto LAB_003046eb;
  goto LAB_00302b19;
code_r0x00302e2a:
  lVar49 = lVar49 + 8;
  lVar36 = local_170 + lVar17;
  lVar17 = lVar17 + -8;
  if (lVar36 - 8U < 8) goto code_r0x00302e44;
  goto LAB_00302e1d;
code_r0x00302e44:
  puVar37 = puVar25 + -lVar17;
  puVar59 = (ulong *)((long)puVar3 - lVar17);
  uVar38 = lVar17 + local_170;
LAB_00302e5d:
  if (uVar38 != 0) {
    uVar26 = 0;
    do {
      uVar61 = uVar26;
      if (puVar37[uVar26] != *(uint8_t *)((long)puVar59 + uVar26)) break;
      uVar26 = uVar26 + 1;
      uVar61 = uVar38;
    } while (uVar38 != uVar26);
    puVar37 = puVar37 + uVar61;
  }
  uVar38 = (long)puVar37 - (long)puVar25;
LAB_00302eb0:
  if (3 < uVar38) {
    iVar31 = 0x1f;
    if ((uint)uVar60 != 0) {
      for (; (uint)uVar60 >> iVar31 == 0; iVar31 = iVar31 + -1) {
      }
    }
    uVar26 = (ulong)(iVar31 * -0x1e + 0x780) + uVar38 * 0x87;
    if (local_180 < uVar26) {
      local_100 = uVar60;
      local_f8 = uVar38;
      uVar33 = uVar38;
      local_180 = uVar26;
    }
  }
LAB_00302eee:
  uVar38 = (ulong)uVar35;
  uVar35 = *(ushort *)((long)pvVar10 + uVar38 * 4 + 2);
  uVar38 = (ulong)*(ushort *)((long)pvVar10 + uVar38 * 4);
  sVar50 = sVar50 - 1;
  if (sVar50 == 0) goto LAB_00302f08;
  goto LAB_00302da6;
code_r0x0030406d:
  puVar27 = puVar27 + 1;
  puVar59 = puVar59 + 1;
  lVar17 = uVar53 + lVar49;
  lVar49 = lVar49 + -8;
  if (lVar17 - 8U < 8) goto code_r0x00304087;
  goto LAB_00304061;
code_r0x00304087:
  uVar38 = lVar49 + uVar53;
  if (lVar49 + uVar53 != 0) {
LAB_00304094:
    uVar60 = 0;
    do {
      uVar26 = uVar60;
      if (*(char *)((long)puVar59 + uVar60) != *(char *)((long)puVar27 + uVar60)) break;
      uVar60 = uVar60 + 1;
      uVar26 = uVar38;
    } while (uVar38 != uVar60);
    puVar59 = (ulong *)(uVar26 + (long)puVar59);
  }
  uVar38 = (long)puVar59 - (long)puVar3;
LAB_003040cc:
  if (((uVar38 != 0) && (uVar53 < pBVar8->cutoffTransformsCount + uVar38)) &&
     (uVar53 = (ulong)pBVar8->hash_table_words[uVar24] + lVar1 + uVar34 +
               ((ulong)((uint)(pBVar8->cutoffTransforms >>
                              ((char)(uVar53 - uVar38) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar53 - uVar38) * 4 << (pBVar14->size_bits_by_length[uVar53] & 0x3f)),
     uVar53 <= uVar47)) {
    iVar31 = 0x1f;
    if ((uint)uVar53 != 0) {
      for (; (uint)uVar53 >> iVar31 == 0; iVar31 = iVar31 + -1) {
      }
    }
    uVar60 = (uVar38 * 0x87 - (ulong)(uint)(iVar31 * 0x1e)) + 0x780;
    if (uVar32 <= uVar60) {
      local_15c = (uint)bVar21 - (int)uVar38;
      local_180 = local_180 + 1;
      pHVar11->dict_num_matches = local_180;
      uVar32 = uVar60;
      local_100 = uVar53;
      local_f8 = uVar38;
    }
  }
LAB_00304011:
  uVar24 = uVar24 + 1;
  bVar16 = !bVar57;
  bVar57 = false;
  if (bVar16) goto LAB_00302fb9;
  goto LAB_00303ff0;
code_r0x003030ff:
  uVar53 = uVar53 - 8;
  lVar58 = lVar58 + 8;
  if (uVar53 < 8) goto code_r0x0030310d;
  goto LAB_003030f2;
code_r0x0030310d:
  lVar17 = lVar36 + lVar58;
  puVar59 = (ulong *)(lVar58 + (long)puVar3);
LAB_0030311c:
  if (uVar53 != 0) {
    uVar38 = 0;
    do {
      uVar60 = uVar38;
      if (*(char *)(lVar17 + uVar38) != *(char *)((long)puVar59 + uVar38)) break;
      uVar38 = uVar38 + 1;
      uVar60 = uVar53;
    } while (uVar53 != uVar38);
    lVar17 = lVar17 + uVar60;
  }
  uVar53 = lVar17 - lVar36;
LAB_0030315b:
  if ((1 < uVar53) && (uVar38 = uVar53 * 0x87 + 0x78f, local_180 < uVar38)) {
    if (lVar49 != 0) {
      uVar38 = uVar38 - ((0x1ca10U >> ((byte)lVar49 & 2) & 4) + 0x27);
    }
    if (local_180 < uVar38) {
      if (uVar32 < uVar53) {
        uVar32 = uVar53;
      }
      local_15c = 0;
      local_180 = uVar38;
      local_100 = uVar24;
      local_f8 = uVar53;
    }
  }
LAB_003031bb:
  lVar49 = lVar49 + 1;
  if (lVar49 == 4) goto code_r0x003031c8;
  goto LAB_003030ba;
code_r0x003031c8:
  if (uVar35 != 0xffff) {
LAB_003032e9:
    uVar42 = *puVar18;
    uVar53 = (ulong)(uVar42 & 0x7fffffff);
    uVar38 = uVar47 - uVar53;
    uVar24 = uVar33 - uVar53;
    if (local_170 <= uVar33 - uVar53) {
      uVar24 = local_170;
    }
    if ((((uVar38 <= local_140) && (uVar46 + uVar32 <= ringbuffer_mask)) && (uVar32 < uVar24)) &&
       (ringbuffer[uVar46 + uVar32] == *(uint8_t *)((long)puVar48 + uVar53 + uVar32))) {
      puVar52 = (ulong *)(uVar53 + (long)puVar48);
      puVar59 = puVar52;
      puVar27 = puVar3;
      if (7 < uVar24) {
        lVar49 = 0;
        puVar43 = puVar52;
LAB_00303222:
        if (*puVar27 == *puVar43) goto code_r0x0030322d;
        uVar53 = *puVar43 ^ *puVar27;
        uVar24 = 0;
        if (uVar53 != 0) {
          for (; (uVar53 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar49;
        goto LAB_00303298;
      }
      goto LAB_0030325c;
    }
    goto LAB_00303316;
  }
LAB_0030331e:
  sVar55 = sVar55 + 1;
  if (sVar55 == sVar50) goto LAB_0030333e;
  goto LAB_00302ffc;
code_r0x0030322d:
  puVar27 = puVar27 + 1;
  puVar43 = puVar43 + 1;
  lVar17 = uVar24 + lVar49;
  lVar49 = lVar49 + -8;
  if (lVar17 - 8U < 8) goto code_r0x00303247;
  goto LAB_00303222;
code_r0x00303247:
  uVar24 = uVar24 + lVar49;
  puVar59 = puVar43;
  if (uVar24 != 0) {
LAB_0030325c:
    puVar43 = (ulong *)((long)puVar59 + uVar24);
    uVar53 = 0;
    do {
      if (*(char *)((long)puVar59 + uVar53) != *(char *)((long)puVar27 + uVar53)) {
        puVar43 = (ulong *)((long)puVar59 + uVar53);
        break;
      }
      uVar53 = uVar53 + 1;
    } while (uVar24 != uVar53);
  }
  uVar24 = (long)puVar43 - (long)puVar52;
LAB_00303298:
  if (3 < uVar24) {
    iVar31 = 0x1f;
    if ((uint)uVar38 != 0) {
      for (; (uint)uVar38 >> iVar31 == 0; iVar31 = iVar31 + -1) {
      }
    }
    uVar53 = (ulong)(iVar31 * -0x1e + 0x780) + uVar24 * 0x87;
    if (local_180 < uVar53) {
      local_15c = 0;
      uVar32 = uVar24;
      local_180 = uVar53;
      local_100 = uVar38;
      local_f8 = uVar24;
    }
  }
LAB_00303316:
  puVar18 = puVar18 + 1;
  if ((int)uVar42 < 0) goto LAB_0030331e;
  goto LAB_003032e9;
code_r0x0030352e:
  lVar17 = lVar17 + 8;
  lVar58 = local_148 + lVar36;
  lVar36 = lVar36 + -8;
  if (lVar58 - 8U < 8) goto code_r0x00303548;
  goto LAB_00303521;
code_r0x00303548:
  puVar37 = puVar25 + -lVar36;
  puVar59 = (ulong *)((long)puVar3 - lVar36);
  uVar53 = lVar36 + local_148;
LAB_0030355e:
  if (uVar53 != 0) {
    uVar60 = 0;
    do {
      uVar26 = uVar60;
      if (puVar37[uVar60] != *(uint8_t *)((long)puVar59 + uVar60)) break;
      uVar60 = uVar60 + 1;
      uVar26 = uVar53;
    } while (uVar53 != uVar60);
    puVar37 = puVar37 + uVar26;
  }
  uVar53 = (long)puVar37 - (long)puVar25;
LAB_003035ae:
  if ((1 < uVar53) && (uVar60 = uVar53 * 0x87 + 0x78f, local_190 < uVar60)) {
    if (lVar49 != 0) {
      uVar60 = uVar60 - ((0x1ca10U >> ((byte)lVar49 & 0xe) & 0xe) + 0x27);
    }
    if (local_190 < uVar60) {
      local_178 = uVar38;
      local_1a0 = uVar53;
      local_190 = uVar60;
      local_130 = uVar53;
    }
  }
LAB_003035fc:
  lVar49 = lVar49 + 1;
  if (lVar49 == 10) goto code_r0x0030360e;
  goto LAB_003034cb;
code_r0x0030360e:
  uVar38 = (ulong)uVar42;
  sVar50 = (hasher->privat)._H5.block_size_;
  uVar53 = uVar33 - *(uint *)((long)pvVar9 + uVar38 * 4);
  if (sVar50 != 0) {
    uVar40 = *(ushort *)((long)pvVar9 + uVar38 * 2 + 0x20000);
    uVar26 = 0;
    uVar60 = uVar53;
LAB_00303641:
    uVar26 = uVar60 + uVar26;
    if (uVar26 <= uVar46) {
      if (uVar24 + local_130 <= ringbuffer_mask) {
        uVar61 = uVar33 - uVar26 & ringbuffer_mask;
        uVar60 = local_130 + uVar61;
        if ((ringbuffer_mask < uVar60) || (ringbuffer[uVar24 + local_130] != ringbuffer[uVar60]))
        goto LAB_0030371f;
        puVar25 = ringbuffer + uVar61;
        puVar59 = puVar3;
        puVar37 = puVar25;
        uVar60 = local_170;
        if (7 < local_170) {
          lVar49 = 0;
          lVar17 = 0;
LAB_003036b1:
          if (*(ulong *)((long)puVar3 + lVar49) == *(ulong *)(puVar25 + lVar49))
          goto code_r0x003036be;
          uVar61 = *(ulong *)(puVar25 + lVar49) ^ *(ulong *)((long)puVar3 + lVar49);
          uVar60 = 0;
          if (uVar61 != 0) {
            for (; (uVar61 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
            }
          }
          uVar60 = (uVar60 >> 3 & 0x1fffffff) - lVar17;
          goto LAB_0030376b;
        }
        goto LAB_003036f2;
      }
      goto LAB_0030371f;
    }
  }
LAB_003037a9:
  (hasher->privat)._H42.free_slot_idx[0] = uVar35 + 1;
  *(char *)((long)pvVar9 + (uVar33 & 0xffff) + 0x30000) = cVar39;
  if (0xfffe < uVar53) {
    uVar53 = 0xffff;
  }
  *(short *)((long)pvVar10 + (ulong)uVar35 * 4) = (short)uVar53;
  *(undefined2 *)((long)pvVar10 + (ulong)uVar35 * 4 + 2) =
       *(undefined2 *)((long)pvVar9 + uVar38 * 2 + 0x20000);
  *(int *)((long)pvVar9 + uVar38 * 4) = (int)uVar33;
  *(ushort *)((long)pvVar9 + uVar38 * 2 + 0x20000) = uVar35;
  iVar31 = 0;
  uVar46 = local_1a0;
  if (local_190 == 0x7e4) {
    pHVar11 = (hasher->privat)._H5.common_;
    uVar53 = pHVar11->dict_num_lookups;
    local_168 = pHVar11->dict_num_matches;
    local_190 = 0x7e4;
    uVar46 = local_1a0;
    if (uVar53 >> 7 <= local_168) {
      uVar38 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar37 = pBVar8->hash_table_lengths;
      iVar31 = 0;
      local_190 = 0x7e4;
      bVar57 = true;
LAB_00303d13:
      uVar53 = uVar53 + 1;
      pHVar11->dict_num_lookups = uVar53;
      bVar21 = puVar37[uVar38];
      uVar46 = (ulong)bVar21;
      if ((uVar46 != 0) && (uVar46 <= local_170)) {
        pBVar14 = pBVar8->words;
        puVar27 = (ulong *)(pBVar14->data +
                           (ulong)pBVar14->offsets_by_length[uVar46] +
                           pBVar8->hash_table_words[uVar38] * uVar46);
        puVar59 = puVar3;
        uVar60 = uVar46;
        if (7 < bVar21) {
          lVar49 = 0;
LAB_00303d6f:
          if (*puVar27 == *puVar59) goto code_r0x00303d7a;
          uVar26 = *puVar59 ^ *puVar27;
          uVar60 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
            }
          }
          uVar60 = (uVar60 >> 3 & 0x1fffffff) - lVar49;
          goto LAB_00303ddd;
        }
        goto LAB_00303da1;
      }
      goto LAB_00303e6a;
    }
  }
LAB_00303852:
  local_168 = uVar46;
  local_140 = (params->dist).max_distance;
  sVar50 = (params->dictionary).compound.num_chunks;
  if (sVar50 != 0) {
    sVar55 = (params->dictionary).compound.total_size;
    sVar19 = 0;
LAB_003038a6:
    pPVar12 = (params->dictionary).compound.chunks[sVar19];
    bVar21 = (byte)pPVar12->bucket_bits;
    bVar44 = (byte)pPVar12->slot_bits;
    bVar15 = -(char)pPVar12->hash_bits;
    uVar46 = ((*puVar3 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar21 & 0x3f);
    lVar49 = (1L << (bVar44 & 0x3f)) * 4;
    lVar17 = (1L << (bVar21 & 0x3f)) * 2;
    bVar44 = -bVar44;
    puVar48 = (undefined8 *)
              ((long)&pPVar12[1].magic + (ulong)pPVar12->num_items * 4 + lVar17 + lVar49);
    if (pPVar12->magic != 0xdebcede0) {
      puVar48 = (undefined8 *)*puVar48;
    }
    sVar13 = (params->dictionary).compound.chunk_offsets[sVar19];
    uVar53 = (local_d0 + sVar55) - sVar13;
    uVar38 = (ulong)pPVar12->source_size;
    uVar40 = *(ushort *)((long)&pPVar12[1].magic + (uVar46 & 0xffffffff) * 2 + lVar49);
    puVar18 = (uint *)((long)&pPVar12[1].magic +
                      (ulong)((uint)uVar40 +
                             (&pPVar12[1].magic)
                             [(uint)((int)uVar46 << (bVar44 & 0x1f)) >> (bVar44 & 0x1f)]) * 4 +
                      lVar17 + lVar49);
    lVar49 = 0;
    uVar46 = local_168;
LAB_0030397a:
    uVar60 = (ulong)dist_cache[lVar49];
    if ((uVar53 - uVar38 < uVar60) && (uVar60 <= uVar53)) {
      uVar26 = uVar38 - (uVar53 - uVar60);
      if (local_170 <= uVar26) {
        uVar26 = local_170;
      }
      lVar36 = (uVar53 - uVar60) + (long)puVar48;
      lVar17 = lVar36;
      puVar59 = puVar3;
      if (7 < uVar26) {
        lVar17 = ((uVar47 + sVar55) - sVar13) - uVar60;
        lVar58 = 0;
LAB_003039bc:
        uVar61 = *(ulong *)((long)puVar48 + lVar58 + lVar17);
        if (*(ulong *)((long)puVar3 + lVar58) == uVar61) goto code_r0x003039c9;
        uVar61 = uVar61 ^ *(ulong *)((long)puVar3 + lVar58);
        uVar26 = 0;
        if (uVar61 != 0) {
          for (; (uVar61 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar58;
        goto LAB_00303a35;
      }
      goto LAB_003039ed;
    }
    goto LAB_00303a90;
  }
LAB_00303c33:
  uVar47 = local_180 + 0xaf;
  local_180 = local_190;
  if (local_190 < uVar47) {
    uVar47 = uVar34;
    local_168 = local_f8;
    uVar33 = uVar20;
    iVar31 = local_15c;
    local_d0 = uVar20 + sVar6;
    if (uVar54 <= uVar20 + sVar6) {
      local_d0 = uVar54;
    }
    goto LAB_00304210;
  }
  uVar47 = local_188 + 4;
  local_100 = local_178;
  if (local_e4 == 3) goto LAB_00304210;
  uVar47 = uVar34 + 1;
  local_e4 = local_e4 + 1;
  uVar46 = uVar20 + 5;
  local_148 = local_148 - 1;
  uVar32 = uVar32 + 1;
  uVar34 = uVar47;
  uVar20 = uVar33;
  local_f8 = local_168;
  local_15c = iVar31;
  uVar35 = uVar35 + 1;
  if (uVar2 <= uVar46) goto LAB_00304210;
  goto LAB_003033a5;
code_r0x003036be:
  lVar49 = lVar49 + 8;
  lVar36 = local_148 + lVar17;
  lVar17 = lVar17 + -8;
  if (lVar36 - 8U < 8) goto code_r0x003036d9;
  goto LAB_003036b1;
code_r0x003036d9:
  puVar37 = puVar25 + -lVar17;
  puVar59 = (ulong *)((long)puVar3 - lVar17);
  uVar60 = lVar17 + local_148;
LAB_003036f2:
  if (uVar60 != 0) {
    uVar61 = 0;
    do {
      uVar51 = uVar61;
      if (puVar37[uVar61] != *(uint8_t *)((long)puVar59 + uVar61)) break;
      uVar61 = uVar61 + 1;
      uVar51 = uVar60;
    } while (uVar60 != uVar61);
    puVar37 = puVar37 + uVar51;
  }
  uVar60 = (long)puVar37 - (long)puVar25;
LAB_0030376b:
  if (3 < uVar60) {
    iVar31 = 0x1f;
    if ((uint)uVar26 != 0) {
      for (; (uint)uVar26 >> iVar31 == 0; iVar31 = iVar31 + -1) {
      }
    }
    uVar61 = (ulong)(iVar31 * -0x1e + 0x780) + uVar60 * 0x87;
    if (local_190 < uVar61) {
      local_178 = uVar26;
      local_1a0 = uVar60;
      local_190 = uVar61;
      local_130 = uVar60;
    }
  }
LAB_0030371f:
  uVar60 = (ulong)uVar40;
  uVar40 = *(ushort *)((long)pvVar10 + uVar60 * 4 + 2);
  uVar60 = (ulong)*(ushort *)((long)pvVar10 + uVar60 * 4);
  sVar50 = sVar50 - 1;
  if (sVar50 == 0) goto LAB_003037a9;
  goto LAB_00303641;
code_r0x00303d7a:
  puVar27 = puVar27 + 1;
  puVar59 = puVar59 + 1;
  lVar17 = uVar46 + lVar49;
  lVar49 = lVar49 + -8;
  if (lVar17 - 8U < 8) goto code_r0x00303d94;
  goto LAB_00303d6f;
code_r0x00303d94:
  uVar60 = lVar49 + uVar46;
  if (lVar49 + uVar46 != 0) {
LAB_00303da1:
    uVar26 = 0;
    do {
      uVar61 = uVar26;
      if (*(char *)((long)puVar59 + uVar26) != *(char *)((long)puVar27 + uVar26)) break;
      uVar26 = uVar26 + 1;
      uVar61 = uVar60;
    } while (uVar60 != uVar26);
    puVar59 = (ulong *)((long)puVar59 + uVar61);
  }
  uVar60 = (long)puVar59 - (long)puVar3;
LAB_00303ddd:
  if (((uVar60 != 0) && (uVar46 < pBVar8->cutoffTransformsCount + uVar60)) &&
     (uVar46 = (ulong)pBVar8->hash_table_words[uVar38] + lVar1 + local_d0 +
               ((ulong)((uint)(pBVar8->cutoffTransforms >>
                              ((char)(uVar46 - uVar60) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar46 - uVar60) * 4 << (pBVar14->size_bits_by_length[uVar46] & 0x3f)),
     uVar46 <= local_140)) {
    iVar28 = 0x1f;
    if ((uint)uVar46 != 0) {
      for (; (uint)uVar46 >> iVar28 == 0; iVar28 = iVar28 + -1) {
      }
    }
    uVar26 = (uVar60 * 0x87 - (ulong)(uint)(iVar28 * 0x1e)) + 0x780;
    if (local_190 <= uVar26) {
      iVar31 = (uint)bVar21 - (int)uVar60;
      local_168 = local_168 + 1;
      pHVar11->dict_num_matches = local_168;
      local_178 = uVar46;
      local_1a0 = uVar60;
      local_190 = uVar26;
    }
  }
LAB_00303e6a:
  uVar38 = uVar38 + 1;
  bVar16 = !bVar57;
  uVar46 = local_1a0;
  bVar57 = false;
  if (bVar16) goto LAB_00303852;
  goto LAB_00303d13;
code_r0x003039c9:
  uVar26 = uVar26 - 8;
  lVar58 = lVar58 + 8;
  if (uVar26 < 8) goto code_r0x003039d7;
  goto LAB_003039bc;
code_r0x003039d7:
  lVar17 = (long)puVar48 + lVar58 + lVar17;
  puVar59 = (ulong *)(lVar58 + (long)puVar3);
LAB_003039ed:
  if (uVar26 != 0) {
    uVar61 = 0;
    do {
      uVar51 = uVar61;
      if (*(char *)(lVar17 + uVar61) != *(char *)((long)puVar59 + uVar61)) break;
      uVar61 = uVar61 + 1;
      uVar51 = uVar26;
    } while (uVar26 != uVar61);
    lVar17 = lVar17 + uVar51;
  }
  uVar26 = lVar17 - lVar36;
LAB_00303a35:
  if ((1 < uVar26) && (uVar61 = uVar26 * 0x87 + 0x78f, local_190 < uVar61)) {
    if (lVar49 != 0) {
      uVar61 = uVar61 - ((0x1ca10U >> ((byte)lVar49 & 2) & 4) + 0x27);
    }
    if (local_190 < uVar61) {
      if (uVar46 < uVar26) {
        uVar46 = uVar26;
      }
      iVar31 = 0;
      local_190 = uVar61;
      local_178 = uVar60;
      local_168 = uVar26;
    }
  }
LAB_00303a90:
  lVar49 = lVar49 + 1;
  if (lVar49 == 4) goto code_r0x00303a9d;
  goto LAB_0030397a;
code_r0x00303a9d:
  if (uVar40 != 0xffff) {
LAB_00303aae:
    uVar42 = *puVar18;
    uVar51 = (ulong)(uVar42 & 0x7fffffff);
    uVar61 = uVar53 - uVar51;
    uVar60 = uVar38 - uVar51;
    uVar26 = local_170;
    if (uVar60 < local_170) {
      uVar26 = uVar60;
    }
    if ((((uVar61 <= local_140) && (uVar24 + uVar46 <= ringbuffer_mask)) && (uVar46 < uVar26)) &&
       (ringbuffer[uVar24 + uVar46] == *(uint8_t *)((long)puVar48 + uVar46 + uVar51))) {
      puVar52 = (ulong *)(uVar51 + (long)puVar48);
      puVar59 = puVar52;
      puVar27 = puVar3;
      if (7 < uVar26) {
        uVar26 = uVar60;
        if (local_148 < uVar60) {
          uVar26 = local_148;
        }
        lVar49 = 0;
        puVar43 = puVar52;
LAB_00303b38:
        if (*puVar27 == *puVar43) goto code_r0x00303b43;
        uVar26 = *puVar43 ^ *puVar27;
        uVar60 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
          }
        }
        uVar60 = (uVar60 >> 3 & 0x1fffffff) - lVar49;
        goto LAB_00303bb4;
      }
      goto LAB_00303b79;
    }
    goto LAB_00303ad9;
  }
LAB_00303c07:
  sVar19 = sVar19 + 1;
  if (sVar19 == sVar50) goto LAB_00303c33;
  goto LAB_003038a6;
code_r0x00303b43:
  puVar27 = puVar27 + 1;
  puVar43 = puVar43 + 1;
  lVar17 = lVar49 + uVar26;
  lVar49 = lVar49 + -8;
  if (lVar17 - 8U < 8) goto code_r0x00303b5d;
  goto LAB_00303b38;
code_r0x00303b5d:
  if (local_148 < uVar60) {
    uVar60 = local_148;
  }
  uVar26 = uVar60 + lVar49;
  puVar59 = puVar43;
  if (uVar26 != 0) {
LAB_00303b79:
    puVar43 = (ulong *)((long)puVar59 + uVar26);
    uVar60 = 0;
    do {
      if (*(char *)((long)puVar59 + uVar60) != *(char *)((long)puVar27 + uVar60)) {
        puVar43 = (ulong *)((long)puVar59 + uVar60);
        break;
      }
      uVar60 = uVar60 + 1;
    } while (uVar26 != uVar60);
  }
  uVar60 = (long)puVar43 - (long)puVar52;
LAB_00303bb4:
  if (3 < uVar60) {
    iVar28 = 0x1f;
    if ((uint)uVar61 != 0) {
      for (; (uint)uVar61 >> iVar28 == 0; iVar28 = iVar28 + -1) {
      }
    }
    uVar26 = (ulong)(iVar28 * -0x1e + 0x780) + uVar60 * 0x87;
    if (local_190 < uVar26) {
      iVar31 = 0;
      uVar46 = uVar60;
      local_190 = uVar26;
      local_178 = uVar61;
      local_168 = uVar60;
    }
  }
LAB_00303ad9:
  puVar18 = puVar18 + 1;
  if ((int)uVar42 < 0) goto LAB_00303c07;
  goto LAB_00303aae;
LAB_00304210:
  local_d0 = local_d0 + sVar7;
  if (local_d0 < local_100) {
LAB_0030422f:
    uVar20 = local_100 + 0xf;
LAB_00304233:
    if ((local_100 <= local_d0) && (uVar20 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      iVar28 = (int)local_100;
      *dist_cache = iVar28;
      dist_cache[4] = iVar28 + -1;
      dist_cache[5] = iVar28 + 1;
      dist_cache[6] = iVar28 + -2;
      dist_cache[7] = iVar28 + 2;
      dist_cache[8] = iVar28 + -3;
      dist_cache[9] = iVar28 + 3;
    }
  }
  else {
    if (local_100 != (long)*dist_cache) {
      uVar20 = 1;
      if (local_100 != (long)dist_cache[1]) {
        uVar20 = (local_100 + 3) - (long)*dist_cache;
        if (uVar20 < 7) {
          bVar21 = (byte)((int)uVar20 << 2);
          uVar42 = 0x9750468;
        }
        else {
          uVar20 = (local_100 + 3) - (long)dist_cache[1];
          if (6 < uVar20) {
            uVar20 = 2;
            if ((local_100 != (long)dist_cache[2]) && (uVar20 = 3, local_100 != (long)dist_cache[3])
               ) goto LAB_0030422f;
            goto LAB_00304233;
          }
          bVar21 = (byte)((int)uVar20 << 2);
          uVar42 = 0xfdb1ace;
        }
        uVar20 = (ulong)(uVar42 >> (bVar21 & 0x1f) & 0xf);
      }
      goto LAB_00304233;
    }
    uVar20 = 0;
  }
  uVar42 = (uint)uVar47;
  local_110->insert_len_ = uVar42;
  local_110->copy_len_ = iVar31 << 0x19 | (uint)local_168;
  uVar34 = (ulong)(params->dist).num_direct_distance_codes;
  uVar32 = uVar34 + 0x10;
  uVar29 = 0;
  if (uVar32 <= uVar20) {
    uVar56 = (params->dist).distance_postfix_bits;
    bVar21 = (byte)uVar56;
    uVar34 = ((4L << (bVar21 & 0x3f)) + (uVar20 - uVar34)) - 0x10;
    uVar45 = 0x1f;
    uVar30 = (uint)uVar34;
    if (uVar30 != 0) {
      for (; uVar30 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (uVar45 ^ 0xffffffe0) + 0x1f;
    uVar46 = (ulong)((uVar34 >> ((ulong)uVar45 & 0x3f) & 1) != 0);
    lVar49 = (ulong)uVar45 - (ulong)uVar56;
    uVar20 = (~(-1 << (bVar21 & 0x1f)) & uVar30) + uVar32 +
             (uVar46 + lVar49 * 2 + 0xfffe << (bVar21 & 0x3f)) | lVar49 * 0x400;
    uVar29 = (uint32_t)(uVar34 - (uVar46 + 2 << ((byte)uVar45 & 0x3f)) >> (bVar21 & 0x3f));
  }
  local_110->dist_prefix_ = (uint16_t)uVar20;
  local_110->dist_extra_ = uVar29;
  if (5 < uVar47) {
    if (uVar47 < 0x82) {
      uVar42 = 0x1f;
      uVar56 = (uint)(uVar47 - 2);
      if (uVar56 != 0) {
        for (; uVar56 >> uVar42 == 0; uVar42 = uVar42 - 1) {
        }
      }
      uVar42 = (int)(uVar47 - 2 >> ((char)(uVar42 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar42 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar47 < 0x842) {
      uVar56 = 0x1f;
      if (uVar42 - 0x42 != 0) {
        for (; uVar42 - 0x42 >> uVar56 == 0; uVar56 = uVar56 - 1) {
        }
      }
      uVar42 = (uVar56 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar42 = 0x15;
      if (0x1841 < uVar47) {
        uVar42 = (uint)(ushort)(0x17 - (uVar47 < 0x5842));
      }
    }
  }
  uVar56 = iVar31 + (uint)local_168;
  if (uVar56 < 10) {
    uVar45 = uVar56 - 2;
  }
  else if (uVar56 < 0x86) {
    uVar56 = uVar56 - 6;
    uVar45 = 0x1f;
    if (uVar56 != 0) {
      for (; uVar56 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (uVar56 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x1f)) + 0x42 +
             (uVar45 ^ 0xffffffe0) * 2;
  }
  else {
    uVar45 = 0x17;
    if (uVar56 < 0x846) {
      uVar45 = 0x1f;
      if (uVar56 - 0x46 != 0) {
        for (; uVar56 - 0x46 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar45 = (uVar45 ^ 0xffe0) + 0x2c;
    }
  }
  uVar35 = (ushort)uVar45;
  uVar41 = (uVar35 & 7) + ((ushort)uVar42 & 7) * 8;
  if ((((uVar20 & 0x3ff) == 0) && ((ushort)uVar42 < 8)) && (uVar35 < 0x10)) {
    if (7 < uVar35) {
      uVar41 = uVar41 + 0x40;
    }
  }
  else {
    iVar31 = ((uVar42 & 0xffff) >> 3) * 3 + ((uVar45 & 0xffff) >> 3);
    uVar41 = uVar41 + ((ushort)(0x520d40 >> ((char)iVar31 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar31 * 0x40 + 0x40;
  }
  local_110->cmd_prefix_ = uVar41;
  *num_literals = *num_literals + uVar47;
  position = local_168 + uVar33;
  uVar20 = sVar22;
  if (position < sVar22) {
    uVar20 = position;
  }
  uVar32 = uVar33 + 2;
  if (local_100 < local_168 >> 2) {
    uVar34 = position + local_100 * -4;
    if (uVar34 < uVar32) {
      uVar34 = uVar32;
    }
    uVar32 = uVar34;
    if (uVar20 < uVar34) {
      uVar32 = uVar20;
    }
  }
  local_178 = uVar33 + lVar23 + local_168 * 2;
  local_110 = local_110 + 1;
  if (uVar20 <= uVar32) {
    local_188 = 0;
    goto LAB_00304674;
  }
  pvVar9 = (hasher->privat)._H40.extra[0];
  pvVar10 = (hasher->privat)._H40.extra[1];
  uVar35 = (hasher->privat)._H42.free_slot_idx[0];
  do {
    uVar42 = (uint)(*(int *)(ringbuffer + (uVar32 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar34 = (ulong)uVar42;
    uVar47 = uVar32 - *(uint *)((long)pvVar9 + uVar34 * 4);
    *(char *)((long)pvVar9 + (uVar32 & 0xffff) + 0x30000) = (char)uVar42;
    if (0xfffe < uVar47) {
      uVar47 = 0xffff;
    }
    uVar40 = uVar35 + 1;
    *(short *)((long)pvVar10 + (ulong)uVar35 * 4) = (short)uVar47;
    *(undefined2 *)((long)pvVar10 + (ulong)uVar35 * 4 + 2) =
         *(undefined2 *)((long)pvVar9 + uVar34 * 2 + 0x20000);
    *(int *)((long)pvVar9 + uVar34 * 4) = (int)uVar32;
    *(ushort *)((long)pvVar9 + uVar34 * 2 + 0x20000) = uVar35;
    uVar32 = uVar32 + 1;
    uVar35 = uVar40;
  } while (uVar20 != uVar32);
  local_188 = 0;
  goto LAB_0030464b;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}